

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O1

void __thiscall
RenX_LoggingPlugin::RenX_OnGameOver
          (RenX_LoggingPlugin *this,Server *server,WinType winType,TeamType *team,int gScore,
          int nScore)

{
  undefined8 uVar1;
  undefined8 uVar2;
  TeamType TVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  string msg;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  WinType local_4c;
  uint local_48;
  uint local_44;
  code *local_40;
  Server *local_38;
  
  local_38 = server;
  TVar3 = RenX::getEnemy(*team);
  local_44 = gScore;
  local_48 = nScore;
  if (*team == Nod) {
    local_44 = nScore;
    local_48 = gScore;
  }
  if ((*(ulong *)&this->field_0xa0 >> 0x36 & 1) == 0) {
    local_40 = RenX::Server::sendAdmChan;
  }
  else {
    local_40 = RenX::Server::sendLogChan;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  uVar4 = 0x930;
  if (winType == Tie) {
    uVar4 = (ulong)(*team == None) << 5 | 0x950;
  }
  local_4c = winType;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (&this->super_Plugin + uVar4));
  if (*team != None && local_70._M_string_length != 0) {
    uVar1 = *(undefined8 *)(RenX::tags + 0x3a8);
    uVar2 = *(undefined8 *)(RenX::tags + 0x3b0);
    auVar5 = RenX::getTeamColor(*team);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0x3c8);
    uVar2 = *(undefined8 *)(RenX::tags + 0x3d0);
    auVar5 = RenX::getTeamName(*team);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 1000);
    uVar2 = *(undefined8 *)(RenX::tags + 0x3f0);
    auVar5 = RenX::getFullTeamName(*team);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0x1548);
    uVar2 = *(undefined8 *)(RenX::tags + 0x1550);
    string_printf_abi_cxx11_(&local_90,"%d",(ulong)local_44);
    RenX::replace_tag(&local_70,uVar2,uVar1,local_90._M_string_length,local_90._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    uVar1 = *(undefined8 *)(RenX::tags + 0x1568);
    uVar2 = *(undefined8 *)(RenX::tags + 0x1570);
    string_printf_abi_cxx11_(&local_90,"%d",(ulong)local_48);
    RenX::replace_tag(&local_70,uVar2,uVar1,local_90._M_string_length,local_90._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    uVar1 = *(undefined8 *)(RenX::tags + 0xa08);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa10);
    auVar5 = RenX::getTeamColor(TVar3);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0xa28);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa30);
    auVar5 = RenX::getTeamName(TVar3);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0xa48);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa50);
    auVar5 = RenX::getFullTeamName(TVar3);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0x1508);
    uVar2 = *(undefined8 *)(RenX::tags + 0x1510);
    auVar5 = RenX::translateWinType(local_4c);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    (*local_40)(local_38,local_70._M_string_length,local_70._M_dataplus._M_p);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_70,&this->gameOverScoreFmt);
  if (*team == None) {
    if (local_70._M_string_length == 0) goto LAB_00117c08;
    uVar1 = *(undefined8 *)(RenX::tags + 0x3a8);
    uVar2 = *(undefined8 *)(RenX::tags + 0x3b0);
    auVar5 = RenX::getTeamColor(GDI);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0x3c8);
    uVar2 = *(undefined8 *)(RenX::tags + 0x3d0);
    auVar5 = RenX::getTeamName(GDI);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 1000);
    uVar2 = *(undefined8 *)(RenX::tags + 0x3f0);
    auVar5 = RenX::getFullTeamName(GDI);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0x1548);
    uVar2 = *(undefined8 *)(RenX::tags + 0x1550);
    string_printf_abi_cxx11_(&local_90,"%d",(ulong)local_44);
    RenX::replace_tag(&local_70,uVar2,uVar1,local_90._M_string_length,local_90._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    uVar1 = *(undefined8 *)(RenX::tags + 0x1568);
    uVar2 = *(undefined8 *)(RenX::tags + 0x1570);
    string_printf_abi_cxx11_(&local_90,"%d",(ulong)local_48);
    RenX::replace_tag(&local_70,uVar2,uVar1,local_90._M_string_length,local_90._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    uVar1 = *(undefined8 *)(RenX::tags + 0xa08);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa10);
    auVar5 = RenX::getTeamColor(Nod);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0xa28);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa30);
    auVar5 = RenX::getTeamName(Nod);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0xa48);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa50);
    auVar5 = RenX::getFullTeamName(Nod);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0x1508);
    uVar2 = *(undefined8 *)(RenX::tags + 0x1510);
    auVar5 = RenX::translateWinType(local_4c);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
  }
  else {
    if (local_70._M_string_length == 0) goto LAB_00117c08;
    uVar1 = *(undefined8 *)(RenX::tags + 0x3a8);
    uVar2 = *(undefined8 *)(RenX::tags + 0x3b0);
    auVar5 = RenX::getTeamColor(*team);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0x3c8);
    uVar2 = *(undefined8 *)(RenX::tags + 0x3d0);
    auVar5 = RenX::getTeamName(*team);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 1000);
    uVar2 = *(undefined8 *)(RenX::tags + 0x3f0);
    auVar5 = RenX::getFullTeamName(*team);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0x1548);
    uVar2 = *(undefined8 *)(RenX::tags + 0x1550);
    string_printf_abi_cxx11_(&local_90,"%d",(ulong)local_44);
    RenX::replace_tag(&local_70,uVar2,uVar1,local_90._M_string_length,local_90._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    uVar1 = *(undefined8 *)(RenX::tags + 0x1568);
    uVar2 = *(undefined8 *)(RenX::tags + 0x1570);
    string_printf_abi_cxx11_(&local_90,"%d",(ulong)local_48);
    RenX::replace_tag(&local_70,uVar2,uVar1,local_90._M_string_length,local_90._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    uVar1 = *(undefined8 *)(RenX::tags + 0xa08);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa10);
    auVar5 = RenX::getTeamColor(TVar3);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0xa28);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa30);
    auVar5 = RenX::getTeamName(TVar3);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0xa48);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa50);
    auVar5 = RenX::getFullTeamName(TVar3);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0x1508);
    uVar2 = *(undefined8 *)(RenX::tags + 0x1510);
    auVar5 = RenX::translateWinType(local_4c);
    RenX::replace_tag(&local_70,uVar2,uVar1,auVar5._0_8_,auVar5._8_8_);
  }
  (*local_40)(local_38,local_70._M_string_length,local_70._M_dataplus._M_p);
LAB_00117c08:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnGameOver(RenX::Server &server, RenX::WinType winType, const RenX::TeamType &team, int gScore, int nScore)
{
	RenX::TeamType loserTeam = RenX::getEnemy(team);
	int winScore;
	int loseScore;
	switch (team)
	{
	default:
	case RenX::TeamType::GDI:
		winScore = gScore;
		loseScore = nScore;
		break;
	case RenX::TeamType::Nod:
		winScore = nScore;
		loseScore = gScore;
		break;
	}

	logFuncType func;
	if (RenX_LoggingPlugin::gameOverPublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg;
	if (winType == RenX::WinType::Tie)
	{
		if (team == RenX::TeamType::None)
			msg = this->gameOverTieNoWinFmt;
		else
			msg = this->gameOverTieFmt;
	}
	else
		msg = this->gameOverFmt;

	if (!msg.empty() && team != RenX::TeamType::None)
	{
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_COLOR_TAG, RenX::getTeamColor(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_SHORT_TAG, RenX::getTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_LONG_TAG, RenX::getFullTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_WIN_SCORE_TAG, string_printf("%d", winScore));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_LOSE_SCORE_TAG, string_printf("%d", loseScore));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_COLOR_TAG, RenX::getTeamColor(loserTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_SHORT_TAG, RenX::getTeamName(loserTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_LONG_TAG, RenX::getFullTeamName(loserTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_MESSAGE_TAG, RenX::translateWinType(winType));
		(server.*func)(msg);
	}

	msg = this->gameOverScoreFmt;
	if (team == RenX::TeamType::None)
	{
		if (!msg.empty())
		{
			RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_COLOR_TAG, RenX::getTeamColor(RenX::TeamType::GDI));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_SHORT_TAG, RenX::getTeamName(RenX::TeamType::GDI));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_LONG_TAG, RenX::getFullTeamName(RenX::TeamType::GDI));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_WIN_SCORE_TAG, string_printf("%d", winScore));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_LOSE_SCORE_TAG, string_printf("%d", loseScore));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_COLOR_TAG, RenX::getTeamColor(RenX::TeamType::Nod));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_SHORT_TAG, RenX::getTeamName(RenX::TeamType::Nod));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_LONG_TAG, RenX::getFullTeamName(RenX::TeamType::Nod));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_MESSAGE_TAG, RenX::translateWinType(winType));
			(server.*func)(msg);
		}
	}
	else if (!msg.empty())
	{
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_COLOR_TAG, RenX::getTeamColor(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_SHORT_TAG, RenX::getTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_LONG_TAG, RenX::getFullTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_WIN_SCORE_TAG, string_printf("%d", winScore));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_LOSE_SCORE_TAG, string_printf("%d", loseScore));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_COLOR_TAG, RenX::getTeamColor(loserTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_SHORT_TAG, RenX::getTeamName(loserTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_LONG_TAG, RenX::getFullTeamName(loserTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_MESSAGE_TAG, RenX::translateWinType(winType));
		(server.*func)(msg);
	}
}